

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O1

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<vending::vending_def::off,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
::process_event<vending::events::load_done>
          (states_tuple *states,size_t current_state,load_done *event)

{
  bool bVar1;
  event_process_result eVar2;
  invocation_table<vending::events::load_done> *piVar3;
  logic_error *this;
  long lVar4;
  _Any_data *p_Var5;
  bool bVar6;
  invocation_table<vending::events::load_done> inv_table;
  indexes_tuple<0UL,_1UL> local_81;
  states_tuple *local_80;
  load_done *local_78;
  _Any_data local_70;
  long alStack_60 [2];
  undefined1 local_50 [16];
  undefined8 local_40 [2];
  
  local_80 = states;
  local_78 = event;
  if (1 < current_state) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid current state index");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  piVar3 = inner_dispatch_table<std::tuple<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<vending::vending_def::off,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>
           ::state_table<vending::events::load_done,0ul,1ul>(&local_81);
  bVar6 = false;
  lVar4 = 0;
  p_Var5 = &local_70;
  do {
    std::
    function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<vending::vending_def::off,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&,_vending::events::load_done_&&)>
    ::function((function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<vending::vending_def::off,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&,_vending::events::load_done_&&)>
                *)p_Var5,piVar3->_M_elems + lVar4);
    lVar4 = 1;
    bVar1 = !bVar6;
    bVar6 = true;
    p_Var5 = (_Any_data *)local_50;
  } while (bVar1);
  if (alStack_60[current_state * 4] != 0) {
    eVar2 = (**(code **)((long)alStack_60 + current_state * 0x20 + 8))
                      (&local_70 + current_state * 2,local_80,local_78);
    lVar4 = -0x40;
    p_Var5 = (_Any_data *)local_50;
    do {
      if (*(code **)(p_Var5 + 1) != (code *)0x0) {
        (**(code **)(p_Var5 + 1))(p_Var5,p_Var5,__destroy_functor);
      }
      p_Var5 = p_Var5 + -2;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
    return eVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }